

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncmp.c
# Opt level: O0

int strncmp(char *__s1,char *__s2,size_t __n)

{
  bool bVar1;
  size_t local_28;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  local_28 = __n;
  n_local = (size_t)__s2;
  s2_local = __s1;
  while( true ) {
    bVar1 = false;
    if ((local_28 != 0) && (bVar1 = false, *s2_local != '\0')) {
      bVar1 = *s2_local == *(char *)n_local;
    }
    if (!bVar1) break;
    s2_local = s2_local + 1;
    n_local = n_local + 1;
    local_28 = local_28 - 1;
  }
  if (local_28 == 0) {
    s1_local._4_4_ = 0;
  }
  else {
    s1_local._4_4_ = (uint)(byte)*s2_local - (uint)*(byte *)n_local;
  }
  return s1_local._4_4_;
}

Assistant:

int strncmp( const char * s1, const char * s2, size_t n )
{
    while ( n && *s1 && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
        --n;
    }

    if ( n == 0 )
    {
        return 0;
    }
    else
    {
        return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
    }
}